

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_CheckTerrain
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  sector_t *sect;
  bool bVar2;
  int iVar3;
  AActor *ac;
  char *__assertion;
  DAngle angle;
  FName local_24;
  DAngle local_20;
  undefined8 local_18;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003f1966;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ac = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ac != (AActor *)0x0) {
        bVar2 = DObject::IsKindOf((DObject *)ac,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f1966;
        }
        goto LAB_003f187f;
      }
    }
    else if (ac != (AActor *)0x0) goto LAB_003f1956;
    ac = (AActor *)0x0;
LAB_003f187f:
    sect = ac->Sector;
    dVar1 = (ac->__Pos).Z;
    angle.Degrees = secplane_t::ZatPoint(&sect->floorplane,ac);
    if (((dVar1 == angle.Degrees) && (!NAN(dVar1) && !NAN(angle.Degrees))) &&
       ((sect->planes[0].Flags & 0x1d0U) != 0x100)) {
      if (sect->special == 0x76) {
        iVar3 = FTagManager::GetFirstSectorTag(&tagManager,sect);
        local_20.Degrees = (double)((iVar3 + -100) / 10) * 45.0;
        AActor::Thrust(ac,&local_20,(double)((iVar3 + -100) % 10) * 0.0625);
      }
      else if (sect->special == 0x73) {
        local_24.Index = 0xcb;
        local_18 = 0;
        P_DamageMobj(ac,(AActor *)0x0,(AActor *)0x0,999,&local_24,0,angle);
      }
    }
    return 0;
  }
LAB_003f1956:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003f1966:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1ab0,
                "int AF_AActor_A_CheckTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckTerrain)
{
	PARAM_SELF_PROLOGUE(AActor);

	sector_t *sec = self->Sector;

	if (self->Z() == sec->floorplane.ZatPoint(self) && sec->PortalBlocksMovement(sector_t::floor))
	{
		if (sec->special == Damage_InstantDeath)
		{
			P_DamageMobj(self, NULL, NULL, 999, NAME_InstantDeath);
		}
		else if (sec->special == Scroll_StrifeCurrent)
		{
			int anglespeed = tagManager.GetFirstSectorTag(sec) - 100;
			double speed = (anglespeed % 10) / 16.;
			DAngle an = (anglespeed / 10) * (360 / 8.);
			self->Thrust(an, speed);
		}
	}
	return 0;
}